

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O2

void compute_quantized_weights_for_decimation
               (decimation_info *di,float low_bound,float high_bound,float *dec_weight_ideal_value,
               float *weight_set_out,uint8_t *quantized_weight_set,quant_method quant_level)

{
  int iVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  int i;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar12 [32];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar34 [32];
  
  uVar11 = (ulong)di->weight_count;
  if (uVar11 == 0) {
    __assert_fail("weight_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x3d8,
                  "void compute_quantized_weights_for_decimation(const decimation_info &, float, float, const float *, float *, uint8_t *, quant_method)"
                 );
  }
  uVar9 = get_quant_level(quant_level);
  iVar1 = uVar9 - 1;
  auVar17._4_4_ = in_XMM0_Db;
  auVar17._0_4_ = low_bound;
  auVar17._8_4_ = in_XMM0_Dc;
  auVar17._12_4_ = in_XMM0_Dd;
  auVar5._4_4_ = in_XMM1_Db;
  auVar5._0_4_ = high_bound;
  auVar5._8_4_ = in_XMM1_Dc;
  auVar5._12_4_ = in_XMM1_Dd;
  auVar3 = vcmpss_avx(auVar5,auVar17,6);
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  auVar3 = vblendvps_avx(auVar14,auVar5,auVar3);
  if (high_bound <= low_bound) {
    auVar17 = ZEXT816(0) << 0x20;
  }
  auVar12._4_4_ = iVar1;
  auVar12._0_4_ = iVar1;
  auVar12._8_4_ = iVar1;
  auVar12._12_4_ = iVar1;
  auVar12._16_4_ = iVar1;
  auVar12._20_4_ = iVar1;
  auVar12._24_4_ = iVar1;
  auVar12._28_4_ = iVar1;
  fVar16 = auVar17._0_4_;
  fVar7 = auVar3._0_4_ - fVar16;
  fVar13 = 1.0 / fVar7;
  fVar6 = fVar16 * fVar13;
  fVar7 = fVar7 * 0.015625;
  auVar15._4_4_ = fVar6;
  auVar15._0_4_ = fVar6;
  auVar15._8_4_ = fVar6;
  auVar15._12_4_ = fVar6;
  auVar15._16_4_ = fVar6;
  auVar15._20_4_ = fVar6;
  auVar15._24_4_ = fVar6;
  auVar15._28_4_ = fVar6;
  fVar6 = compute_quantized_weights_for_decimation::quant_levels_m1[quant_level];
  auVar3 = vlddqu_avx(*(undefined1 (*) [16])quant_and_xfer_tables[quant_level].quant_to_unquant);
  if (uVar9 < 0x11) {
    auVar18._16_16_ = auVar3;
    auVar18._0_16_ = auVar3;
    auVar25._8_4_ = 0xffffff00;
    auVar25._0_8_ = 0xffffff00ffffff00;
    auVar25._12_4_ = 0xffffff00;
    auVar25._16_4_ = 0xffffff00;
    auVar25._20_4_ = 0xffffff00;
    auVar25._24_4_ = 0xffffff00;
    auVar25._28_4_ = 0xffffff00;
    auVar28._16_16_ = _DAT_00264650;
    auVar28._0_16_ = _DAT_00264650;
    for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 8) {
      pfVar2 = dec_weight_ideal_value + uVar10;
      auVar30._0_4_ = fVar13 * *pfVar2;
      auVar30._4_4_ = fVar13 * pfVar2[1];
      auVar30._8_4_ = fVar13 * pfVar2[2];
      auVar30._12_4_ = fVar13 * pfVar2[3];
      auVar30._16_4_ = fVar13 * pfVar2[4];
      auVar30._20_4_ = fVar13 * pfVar2[5];
      auVar30._28_36_ = in_ZMM13._28_36_;
      auVar30._24_4_ = fVar13 * pfVar2[6];
      auVar19 = vsubps_avx(auVar30._0_32_,auVar15);
      auVar19 = vmaxps_avx(auVar19,_DAT_00315080);
      auVar21._8_4_ = 0x3f800000;
      auVar21._0_8_ = 0x3f8000003f800000;
      auVar21._12_4_ = 0x3f800000;
      auVar21._16_4_ = 0x3f800000;
      auVar21._20_4_ = 0x3f800000;
      auVar21._24_4_ = 0x3f800000;
      auVar21._28_4_ = 0x3f800000;
      auVar19 = vminps_avx(auVar19,auVar21);
      auVar32._0_4_ = (int)(auVar19._0_4_ * fVar6);
      auVar32._4_4_ = (int)(auVar19._4_4_ * fVar6);
      auVar32._8_4_ = (int)(auVar19._8_4_ * fVar6);
      auVar32._12_4_ = (int)(auVar19._12_4_ * fVar6);
      auVar32._16_4_ = (int)(auVar19._16_4_ * fVar6);
      auVar32._20_4_ = (int)(auVar19._20_4_ * fVar6);
      auVar32._24_4_ = (int)(auVar19._24_4_ * fVar6);
      auVar32._28_4_ = (int)in_ZMM14._28_4_;
      auVar22 = vpsubd_avx2(auVar32,_DAT_0031b020);
      auVar22 = vpminsd_avx2(auVar22,auVar12);
      auVar29 = vpor_avx2(auVar32,auVar25);
      auVar23 = vpshufb_avx2(auVar18,auVar29);
      in_ZMM14 = ZEXT3264(auVar23);
      auVar22 = vpor_avx2(auVar22,auVar25);
      auVar24 = vpshufb_avx2(auVar18,auVar22);
      auVar29 = vcvtdq2ps_avx(auVar23);
      auVar4 = vcvtdq2ps_avx(auVar24);
      auVar26._0_4_ = auVar4._0_4_ + auVar29._0_4_;
      auVar26._4_4_ = auVar4._4_4_ + auVar29._4_4_;
      auVar26._8_4_ = auVar4._8_4_ + auVar29._8_4_;
      auVar26._12_4_ = auVar4._12_4_ + auVar29._12_4_;
      auVar26._16_4_ = auVar4._16_4_ + auVar29._16_4_;
      auVar26._20_4_ = auVar4._20_4_ + auVar29._20_4_;
      auVar26._24_4_ = auVar4._24_4_ + auVar29._24_4_;
      auVar26._28_4_ = auVar4._28_4_ + auVar29._28_4_;
      auVar8._4_4_ = auVar19._4_4_ * 128.0;
      auVar8._0_4_ = auVar19._0_4_ * 128.0;
      auVar8._8_4_ = auVar19._8_4_ * 128.0;
      auVar8._12_4_ = auVar19._12_4_ * 128.0;
      auVar8._16_4_ = auVar19._16_4_ * 128.0;
      auVar8._20_4_ = auVar19._20_4_ * 128.0;
      auVar8._24_4_ = auVar19._24_4_ * 128.0;
      auVar8._28_4_ = auVar19._28_4_;
      auVar22 = vcmpps_avx(auVar26,auVar8,1);
      auVar19 = vblendvps_avx(auVar23,auVar24,auVar22);
      in_ZMM13 = ZEXT3264(auVar19);
      auVar22 = vblendvps_avx(auVar29,auVar4,auVar22);
      auVar19 = vpshufb_avx2(auVar19,auVar28);
      pfVar2 = weight_set_out + uVar10;
      *pfVar2 = fVar16 + fVar7 * auVar22._0_4_;
      pfVar2[1] = fVar16 + fVar7 * auVar22._4_4_;
      pfVar2[2] = fVar16 + fVar7 * auVar22._8_4_;
      pfVar2[3] = fVar16 + fVar7 * auVar22._12_4_;
      pfVar2[4] = fVar16 + fVar7 * auVar22._16_4_;
      pfVar2[5] = fVar16 + fVar7 * auVar22._20_4_;
      pfVar2[6] = fVar16 + fVar7 * auVar22._24_4_;
      pfVar2[7] = fVar16 + auVar22._28_4_;
      auVar3 = vpunpckldq_avx(auVar19._0_16_,auVar19._16_16_);
      *(long *)(quantized_weight_set + uVar10) = auVar3._0_8_;
    }
  }
  else {
    auVar5 = vlddqu_avx(*(undefined1 (*) [16])
                         (quant_and_xfer_tables[quant_level].quant_to_unquant + 0x10));
    auVar19._16_16_ = auVar3;
    auVar19._0_16_ = auVar3;
    auVar20._0_8_ = auVar5._0_8_ ^ auVar3._0_8_;
    auVar20._8_8_ = auVar5._8_8_ ^ auVar3._8_8_;
    auVar22._16_16_ = auVar20;
    auVar22._0_16_ = auVar20;
    auVar29._16_16_ = _DAT_00264650;
    auVar29._0_16_ = _DAT_00264650;
    for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 8) {
      pfVar2 = dec_weight_ideal_value + uVar10;
      auVar31._0_4_ = fVar13 * *pfVar2;
      auVar31._4_4_ = fVar13 * pfVar2[1];
      auVar31._8_4_ = fVar13 * pfVar2[2];
      auVar31._12_4_ = fVar13 * pfVar2[3];
      auVar31._16_4_ = fVar13 * pfVar2[4];
      auVar31._20_4_ = fVar13 * pfVar2[5];
      auVar31._28_36_ = in_ZMM13._28_36_;
      auVar31._24_4_ = fVar13 * pfVar2[6];
      auVar18 = vsubps_avx(auVar31._0_32_,auVar15);
      auVar18 = vmaxps_avx(auVar18,_DAT_00315080);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar23._16_4_ = 0x3f800000;
      auVar23._20_4_ = 0x3f800000;
      auVar23._24_4_ = 0x3f800000;
      auVar23._28_4_ = 0x3f800000;
      auVar18 = vminps_avx(auVar18,auVar23);
      auVar33._0_4_ = (int)(auVar18._0_4_ * fVar6);
      auVar33._4_4_ = (int)(auVar18._4_4_ * fVar6);
      auVar33._8_4_ = (int)(auVar18._8_4_ * fVar6);
      auVar33._12_4_ = (int)(auVar18._12_4_ * fVar6);
      auVar33._16_4_ = (int)(auVar18._16_4_ * fVar6);
      auVar33._20_4_ = (int)(auVar18._20_4_ * fVar6);
      auVar33._24_4_ = (int)(auVar18._24_4_ * fVar6);
      auVar33._28_4_ = (int)in_ZMM14._28_4_;
      auVar4 = vpsubd_avx2(auVar33,_DAT_0031b020);
      auVar23 = vpminsd_avx2(auVar4,auVar12);
      auVar24._8_4_ = 0xffffff00;
      auVar24._0_8_ = 0xffffff00ffffff00;
      auVar24._12_4_ = 0xffffff00;
      auVar24._16_4_ = 0xffffff00;
      auVar24._20_4_ = 0xffffff00;
      auVar24._24_4_ = 0xffffff00;
      auVar24._28_4_ = 0xffffff00;
      auVar4 = vpor_avx2(auVar33,auVar24);
      auVar33 = vpshufb_avx2(auVar19,auVar4);
      auVar27[8] = 0xf0;
      auVar27._0_8_ = 0xf0f0f0f0f0f0f0f0;
      auVar27[9] = 0xf0;
      auVar27[10] = 0xf0;
      auVar27[0xb] = 0xf0;
      auVar27[0xc] = 0xf0;
      auVar27[0xd] = 0xf0;
      auVar27[0xe] = 0xf0;
      auVar27[0xf] = 0xf0;
      auVar27[0x10] = 0xf0;
      auVar27[0x11] = 0xf0;
      auVar27[0x12] = 0xf0;
      auVar27[0x13] = 0xf0;
      auVar27[0x14] = 0xf0;
      auVar27[0x15] = 0xf0;
      auVar27[0x16] = 0xf0;
      auVar27[0x17] = 0xf0;
      auVar27[0x18] = 0xf0;
      auVar27[0x19] = 0xf0;
      auVar27[0x1a] = 0xf0;
      auVar27[0x1b] = 0xf0;
      auVar27[0x1c] = 0xf0;
      auVar27[0x1d] = 0xf0;
      auVar27[0x1e] = 0xf0;
      auVar27[0x1f] = 0xf0;
      auVar4 = vpaddb_avx2(auVar4,auVar27);
      auVar25 = vpshufb_avx2(auVar22,auVar4);
      auVar4 = vpor_avx2(auVar23,auVar24);
      auVar28 = vpshufb_avx2(auVar19,auVar4);
      auVar4 = vpaddb_avx2(auVar4,auVar27);
      auVar27 = vpshufb_avx2(auVar22,auVar4);
      auVar23 = vcvtdq2ps_avx(auVar25 ^ auVar33);
      auVar24 = vcvtdq2ps_avx(auVar27 ^ auVar28);
      in_ZMM14 = ZEXT3264(auVar24);
      auVar34._0_4_ = auVar23._0_4_ + auVar24._0_4_;
      auVar34._4_4_ = auVar23._4_4_ + auVar24._4_4_;
      auVar34._8_4_ = auVar23._8_4_ + auVar24._8_4_;
      auVar34._12_4_ = auVar23._12_4_ + auVar24._12_4_;
      auVar34._16_4_ = auVar23._16_4_ + auVar24._16_4_;
      auVar34._20_4_ = auVar23._20_4_ + auVar24._20_4_;
      auVar34._24_4_ = auVar23._24_4_ + auVar24._24_4_;
      auVar34._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar4._4_4_ = auVar18._4_4_ * 128.0;
      auVar4._0_4_ = auVar18._0_4_ * 128.0;
      auVar4._8_4_ = auVar18._8_4_ * 128.0;
      auVar4._12_4_ = auVar18._12_4_ * 128.0;
      auVar4._16_4_ = auVar18._16_4_ * 128.0;
      auVar4._20_4_ = auVar18._20_4_ * 128.0;
      auVar4._24_4_ = auVar18._24_4_ * 128.0;
      auVar4._28_4_ = auVar18._28_4_;
      auVar4 = vcmpps_avx(auVar34,auVar4,1);
      in_ZMM13 = ZEXT3264(auVar4);
      auVar18 = vblendvps_avx(auVar25 ^ auVar33,auVar27 ^ auVar28,auVar4);
      auVar4 = vblendvps_avx(auVar23,auVar24,auVar4);
      auVar18 = vpshufb_avx2(auVar18,auVar29);
      pfVar2 = weight_set_out + uVar10;
      *pfVar2 = auVar4._0_4_ * fVar7 + fVar16;
      pfVar2[1] = auVar4._4_4_ * fVar7 + fVar16;
      pfVar2[2] = auVar4._8_4_ * fVar7 + fVar16;
      pfVar2[3] = auVar4._12_4_ * fVar7 + fVar16;
      pfVar2[4] = auVar4._16_4_ * fVar7 + fVar16;
      pfVar2[5] = auVar4._20_4_ * fVar7 + fVar16;
      pfVar2[6] = auVar4._24_4_ * fVar7 + fVar16;
      pfVar2[7] = auVar4._28_4_ + fVar16;
      auVar3 = vpunpckldq_avx(auVar18._0_16_,auVar18._16_16_);
      *(long *)(quantized_weight_set + uVar10) = auVar3._0_8_;
    }
  }
  return;
}

Assistant:

void compute_quantized_weights_for_decimation(
	const decimation_info& di,
	float low_bound,
	float high_bound,
	const float* dec_weight_ideal_value,
	float* weight_set_out,
	uint8_t* quantized_weight_set,
	quant_method quant_level
) {
	int weight_count = di.weight_count;
	promise(weight_count > 0);
	const quant_and_transfer_table& qat = quant_and_xfer_tables[quant_level];

	// The available quant levels, stored with a minus 1 bias
	static const float quant_levels_m1[12] {
		1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 7.0f, 9.0f, 11.0f, 15.0f, 19.0f, 23.0f, 31.0f
	};

	vint steps_m1(get_quant_level(quant_level) - 1);
	float quant_level_m1 = quant_levels_m1[quant_level];

	// Quantize the weight set using both the specified low/high bounds and standard 0..1 bounds

	// TODO: Oddity to investigate; triggered by test in issue #265.
	if (high_bound <= low_bound)
	{
		low_bound = 0.0f;
		high_bound = 1.0f;
	}

	float rscale = high_bound - low_bound;
	float scale = 1.0f / rscale;

	float scaled_low_bound = low_bound * scale;
	rscale *= 1.0f / 64.0f;

	vfloat scalev(scale);
	vfloat scaled_low_boundv(scaled_low_bound);
	vfloat quant_level_m1v(quant_level_m1);
	vfloat rscalev(rscale);
	vfloat low_boundv(low_bound);

	// This runs to the rounded-up SIMD size, which is safe as the loop tail is filled with known
	// safe data in compute_ideal_weights_for_decimation and arrays are always 64 elements
	if (get_quant_level(quant_level) <= 16)
	{
		vtable_16x8 table;
		vtable_prepare(table, qat.quant_to_unquant);

		for (int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat ix = loada(dec_weight_ideal_value + i) * scalev - scaled_low_boundv;
			ix = clampzo(ix);

			// Look up the two closest indexes and return the one that was closest
			vfloat ix1 = ix * quant_level_m1v;

			vint weightl = float_to_int(ix1);
			vint weighth = min(weightl + vint(1), steps_m1);

			vint ixli = vtable_lookup_32bit(table, weightl);
			vint ixhi = vtable_lookup_32bit(table, weighth);

			vfloat ixl = int_to_float(ixli);
			vfloat ixh = int_to_float(ixhi);

			vmask mask = (ixl + ixh) < (vfloat(128.0f) * ix);
			vint weight = select(ixli, ixhi, mask);
			ixl = select(ixl, ixh, mask);

			// Invert the weight-scaling that was done initially
			storea(ixl * rscalev + low_boundv, weight_set_out + i);
			pack_and_store_low_bytes(weight, quantized_weight_set + i);
		}
	}
	else
	{
		vtable_32x8 table;
		vtable_prepare(table, qat.quant_to_unquant);

		for (int i = 0; i < weight_count; i += ASTCENC_SIMD_WIDTH)
		{
			vfloat ix = loada(dec_weight_ideal_value + i) * scalev - scaled_low_boundv;
			ix = clampzo(ix);

			// Look up the two closest indexes and return the one that was closest
			vfloat ix1 = ix * quant_level_m1v;

			vint weightl = float_to_int(ix1);
			vint weighth = min(weightl + vint(1), steps_m1);

			vint ixli = vtable_lookup_32bit(table, weightl);
			vint ixhi = vtable_lookup_32bit(table, weighth);

			vfloat ixl = int_to_float(ixli);
			vfloat ixh = int_to_float(ixhi);

			vmask mask = (ixl + ixh) < (vfloat(128.0f) * ix);
			vint weight = select(ixli, ixhi, mask);
			ixl = select(ixl, ixh, mask);

			// Invert the weight-scaling that was done initially
			storea(ixl * rscalev + low_boundv, weight_set_out + i);
			pack_and_store_low_bytes(weight, quantized_weight_set + i);
		}
	}
}